

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O3

int main(void)

{
  undefined1 *puVar1;
  string *psVar2;
  ulong uVar3;
  copyable *pcVar4;
  value cfg;
  service srv;
  test_app app;
  value local_120;
  value local_118;
  bool local_109;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 local_e8 [160];
  application local_48 [40];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Basics no throw",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  cppcms::json::value::copyable::copyable(&local_118.d);
  cppcms::json::value::value<char[12]>(&local_120,(char (*) [12])"en_US.UTF-8");
  puVar1 = local_e8 + 0x10;
  local_e8._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"localization","");
  psVar2 = (string *)cppcms::json::value::operator[]((string *)&local_118);
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"locales","");
  uVar3 = cppcms::json::value::operator[](psVar2);
  pcVar4 = (copyable *)cppcms::json::value::operator[](uVar3);
  cppcms::json::value::copyable::operator=(pcVar4,&local_120.d);
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0]);
  }
  if ((undefined1 *)local_e8._0_8_ != puVar1) {
    operator_delete((void *)local_e8._0_8_);
  }
  cppcms::json::value::copyable::~copyable(&local_120.d);
  cppcms::service::service((service *)local_e8,&local_118);
  basic_test((service *)local_e8,false);
  cppcms::service::~service((service *)local_e8);
  local_109 = true;
  cppcms::json::value::value<bool>(&local_120,&local_109);
  local_e8._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"misc","");
  psVar2 = (string *)cppcms::json::value::operator[]((string *)&local_118);
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"invalid_url_throws","");
  pcVar4 = (copyable *)cppcms::json::value::operator[](psVar2);
  cppcms::json::value::copyable::operator=(pcVar4,&local_120.d);
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0]);
  }
  if ((undefined1 *)local_e8._0_8_ != puVar1) {
    operator_delete((void *)local_e8._0_8_);
  }
  cppcms::json::value::copyable::~copyable(&local_120.d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Basics throw",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  cppcms::service::service((service *)local_e8,&local_118);
  basic_test((service *)local_e8,true);
  cppcms::service::~service((service *)local_e8);
  cppcms::service::service((service *)local_108,&local_118);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Hierarchy ",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  test_app::test_app((test_app *)local_e8,(service *)local_108);
  test_app::test_hierarchy((test_app *)local_e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Mappting",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  test_app::test_mapping((test_app *)local_e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"- Keyword substitution",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  test_app::test_keywords((test_app *)local_e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Dispatcher Test",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  dispatcher_test((service *)local_108);
  local_e8._0_8_ = &PTR__test_app_0013fbf8;
  local_e8._120_8_ = &PTR__test2_0013fc98;
  cppcms::application::~application(local_48);
  cppcms::application::~application((application *)(local_e8 + 0x78));
  cppcms::application::~application((application *)(local_e8 + 0x50));
  cppcms::application::~application((application *)(local_e8 + 0x28));
  cppcms::application::~application((application *)local_e8);
  cppcms::service::~service((service *)local_108);
  cppcms::json::value::copyable::~copyable(&local_118.d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
	try {


		std::cout << "- Basics no throw" << std::endl;

		cppcms::json::value cfg;
		cfg["localization"]["locales"][0]="en_US.UTF-8";
		{
			cppcms::service srv(cfg);
			basic_test(srv,false);
		}

		cfg["misc"]["invalid_url_throws"]=true;
		std::cout << "- Basics throw" << std::endl;

		{
			cppcms::service srv(cfg);
			basic_test(srv,true);
		}

		cppcms::service srv(cfg);
		
		std::cout << "- Hierarchy " << std::endl;
		test_app app(srv);

		app.test_hierarchy();

		std::cout << "- Mappting" << std::endl;
		app.test_mapping();
		std::cout << "- Keyword substitution" << std::endl;
		app.test_keywords();

		std::cout << "- Dispatcher Test" << std::endl;
		dispatcher_test(srv);

	}
	catch(std::exception const &e) {
		std::cerr << "Fail: " << e.what() << std::endl;
		return 1;
	}
	std::cout << "ok" << std::endl;
	return 0;
}